

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
writeValueAttribute(UA_Server *server,UA_VariableNode *node,UA_DataValue *value,
                   UA_String *indexRange)

{
  UA_StatusCode UVar1;
  UA_VariableNode *writtenNode;
  UA_DataValue editableValue;
  UA_NumericRange *pUStack_48;
  UA_StatusCode retval;
  UA_NumericRange *rangeptr;
  UA_NumericRange range;
  UA_String *indexRange_local;
  UA_DataValue *value_local;
  UA_VariableNode *node_local;
  UA_Server *server_local;
  
  pUStack_48 = (UA_NumericRange *)0x0;
  editableValue._92_4_ = 0;
  range.dimensions = (UA_NumericRangeDimension *)indexRange;
  if ((indexRange != (UA_String *)0x0) && (indexRange->length != 0)) {
    UVar1 = parse_numericrange(indexRange,(UA_NumericRange *)&rangeptr);
    if (UVar1 != 0) {
      return UVar1;
    }
    pUStack_48 = (UA_NumericRange *)&rangeptr;
  }
  editableValue._92_4_ = 0;
  memcpy(&writtenNode,value,0x60);
  editableValue.value.type._0_4_ = 1;
  if ((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) != (undefined1  [96])0x0)
  {
    editableValue._92_4_ =
         typeCheckValue(server,&node->dataType,node->valueRank,node->arrayDimensionsSize,
                        node->arrayDimensions,&value->value,pUStack_48,(UA_Variant *)&editableValue)
    ;
    if (editableValue._92_4_ != 0) goto LAB_0012b956;
    editableValue._92_4_ = 0;
  }
  if (((byte)writtenNode >> 2 & 1) == 0) {
    editableValue._56_8_ = UA_DateTime_now();
    writtenNode._0_1_ = (byte)writtenNode & 0xfb | 4;
  }
  if (node->valueSource == UA_VALUESOURCE_DATA) {
    if (pUStack_48 == (UA_NumericRange *)0x0) {
      editableValue._92_4_ = writeValueAttributeWithoutRange(node,(UA_DataValue *)&writtenNode);
    }
    else {
      editableValue._92_4_ =
           writeValueAttributeWithRange(node,(UA_DataValue *)&writtenNode,pUStack_48);
    }
    if ((editableValue._92_4_ == 0) &&
       ((node->value).data.callback.onWrite !=
        (_func_void_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr *)0x0)) {
      (**(code **)((long)&node->value + 0x70))
                ((node->value).data.callback.handle,(undefined1 *)((long)&node->value + 8),
                 pUStack_48);
    }
  }
  else if ((node->value).dataSource.write ==
           (_func_UA_StatusCode_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr *)0x0) {
    editableValue._92_4_ = 0x80730000;
  }
  else {
    editableValue._92_4_ =
         (*(node->value).dataSource.write)
                   ((node->value).dataSource.handle,node->nodeId,(UA_Variant *)&editableValue,
                    pUStack_48);
  }
LAB_0012b956:
  if (pUStack_48 != (UA_NumericRange *)0x0) {
    free((void *)range.dimensionsSize);
  }
  return editableValue._92_4_;
}

Assistant:

UA_StatusCode
writeValueAttribute(UA_Server *server, UA_VariableNode *node,
                    const UA_DataValue *value, const UA_String *indexRange) {
    /* Parse the range */
    UA_NumericRange range;
    UA_NumericRange *rangeptr = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(indexRange && indexRange->length > 0) {
        retval = parse_numericrange(indexRange, &range);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        rangeptr = &range;
    }

    /* Copy the value into an editable "container" where e.g. the datatype can
     * be adjusted. The data itself is not written into. */
    UA_DataValue editableValue = *value;
    editableValue.value.storageType = UA_VARIANT_DATA_NODELETE;

    /* Type checking. May change the type of editableValue */
    if(value->hasValue) {
        retval = typeCheckValue(server, &node->dataType, node->valueRank,
                                node->arrayDimensionsSize, node->arrayDimensions,
                                &value->value, rangeptr, &editableValue.value);
        if(retval != UA_STATUSCODE_GOOD)
            goto cleanup;
    }

    /* Set the source timestamp if there is none */
    if(!editableValue.hasSourceTimestamp) {
        editableValue.sourceTimestamp = UA_DateTime_now();
        editableValue.hasSourceTimestamp = true;
    }

    /* Ok, do it */
    if(node->valueSource == UA_VALUESOURCE_DATA) {
        if(!rangeptr)
            retval = writeValueAttributeWithoutRange(node, &editableValue);
        else
            retval = writeValueAttributeWithRange(node, &editableValue, rangeptr);

        /* Callback after writing */
        if(retval == UA_STATUSCODE_GOOD && node->value.data.callback.onWrite) {
            const UA_VariableNode *writtenNode;
#ifdef UA_ENABLE_MULTITHREADING
            /* Reopen the node to see the changes (multithreading only) */
            writtenNode = (const UA_VariableNode*)UA_NodeStore_get(server->nodestore, &node->nodeId);
#else
            writtenNode = node; /* The node is written in-situ (TODO: this might
                                   change with the nodestore plugin approach) */
#endif
            UA_RCU_UNLOCK();
            writtenNode->value.data.callback.onWrite(writtenNode->value.data.callback.handle,
                                                     writtenNode->nodeId,
                                                     &writtenNode->value.data.value.value, rangeptr);
            UA_RCU_LOCK();
        }
    } else {
        if(node->value.dataSource.write) {
            UA_RCU_UNLOCK();
            retval = node->value.dataSource.write(node->value.dataSource.handle,
                                                  node->nodeId, &editableValue.value, rangeptr);
            UA_RCU_LOCK();
        } else {
            retval = UA_STATUSCODE_BADWRITENOTSUPPORTED;
        }
    }

    /* Clean up */
 cleanup:
    if(rangeptr)
        UA_free(range.dimensions);
    return retval;
}